

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall
re2::RE2::NamedCapturingGroups::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,RE2 *re)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar1;
  long in_RSI;
  Regexp *in_stack_00000030;
  
  if (*(long *)(in_RSI + 0x68) != 0) {
    pmVar1 = Regexp::NamedCaptures_abi_cxx11_(in_stack_00000030);
    *(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      **)(in_RSI + 0xb8) = pmVar1;
  }
  if (*(long *)(in_RSI + 0xb8) == 0) {
    *(undefined8 *)(in_RSI + 0xb8) = empty_named_groups_abi_cxx11_;
  }
  return;
}

Assistant:

const std::map<std::string, int>& RE2::NamedCapturingGroups() const {
  std::call_once(named_groups_once_, [](const RE2* re) {
    if (re->suffix_regexp_ != NULL)
      re->named_groups_ = re->suffix_regexp_->NamedCaptures();
    if (re->named_groups_ == NULL)
      re->named_groups_ = empty_named_groups;
  }, this);
  return *named_groups_;
}